

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

Var Js::GlobalObject::EntryParseFloat(RecyclableObject *function,CallInfo callInfo,...)

{
  char16 *value;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  Var pvVar6;
  CharClassifier *this;
  LPCOLESTR psz;
  int in_stack_00000010;
  OLECHAR *local_60;
  char16 *pch;
  CallInfo local_50;
  CallInfo callInfo_local;
  undefined1 local_40 [8];
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_50._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x4b6,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b5af3f;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_40 = (undefined1  [8])local_50;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_40,&local_50);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_50 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x4b9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b5af3f;
    *puVar4 = 0;
  }
  if (((ulong)local_40 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x4bb,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00b5af3f;
    *puVar4 = 0;
  }
  EnterPinnedScope((void **)&callInfo_local);
  if (((ulong)local_40 & 0xfffffe) == 0) {
    value = (char16 *)NAN;
  }
  else {
    pvVar5 = Arguments::operator[]((Arguments *)local_40,1);
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00b5af3f;
      *puVar4 = 0;
    }
    pvVar6 = Arguments::operator[]((Arguments *)local_40,1);
    if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      return pvVar6;
    }
    pvVar5 = Arguments::operator[]((Arguments *)local_40,1);
    if ((ulong)pvVar6 >> 0x32 != 0) {
      if (pvVar5 < (Var)0x4000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                    ,0xd4,"(Is(aValue))",
                                    "Ensure var is actually a \'JavascriptNumber\'");
        if (!bVar3) {
LAB_00b5af3f:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      bVar3 = NumberUtilities::IsSpecial
                        ((double)((ulong)pvVar5 ^ 0xfffc000000000000),0x8000000000000000);
      if (bVar3) {
        return &DAT_1000000000000;
      }
      pvVar5 = Arguments::operator[]((Arguments *)local_40,1);
      return pvVar5;
    }
    bVar3 = VarIs<Js::JavascriptString>(pvVar5);
    pvVar5 = Arguments::operator[]((Arguments *)local_40,1);
    if (bVar3) {
      callInfo_local = (CallInfo)VarTo<Js::JavascriptString>(pvVar5);
    }
    else {
      callInfo_local = (CallInfo)JavascriptConversion::ToString(pvVar5,pSVar1);
    }
    this = ScriptContext::GetCharClassifier(pSVar1);
    psz = (LPCOLESTR)(**(code **)(*(long *)callInfo_local + 0x328))();
    local_60 = CharClassifier::SkipWhiteSpace(this,psz);
    pch = (char16 *)NumberUtilities::StrToDbl<char16_t>(local_60,&local_60,pSVar1);
    LeavePinnedScope();
    value = pch;
  }
  pvVar5 = JavascriptNumber::ToVarNoCheck((double)value,pSVar1);
  return pvVar5;
}

Assistant:

Var GlobalObject::EntryParseFloat(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        double result = 0;
        ENTER_PINNED_SCOPE(JavascriptString, str);

        if(args.Info.Count < 2)
        {
            // We're really converting "undefined" here, but "undefined" produces
            // NaN, so just return that directly.
            return JavascriptNumber::ToVarNoCheck(JavascriptNumber::NaN, scriptContext);
        }

        // Short cut for numbers
        if (TaggedInt::Is(args[1]))
        {
            return args[1];
        }
        if(JavascriptNumber::Is_NoTaggedIntCheck(args[1]))
        {
            // If the value is negative zero, return positive zero. Since the parameter type is string, -0 would first be
            // converted to the string "0", then parsed to result in positive zero.
            return
                JavascriptNumber::IsNegZero(JavascriptNumber::GetValue(args[1])) ?
                    TaggedInt::ToVarUnchecked(0) :
                    args[1];
        }

        // convert input to a string
        if (VarIs<JavascriptString>(args[1]))
        {
            str = VarTo<JavascriptString>(args[1]);
        }
        else
        {
            str = JavascriptConversion::ToString(args[1], scriptContext);
        }

        // skip preceding whitespace
        const char16 *pch = scriptContext->GetCharClassifier()->SkipWhiteSpace(str->GetSz());

        // perform the string -> float conversion
        result = NumberUtilities::StrToDbl(pch, &pch, scriptContext);
        LEAVE_PINNED_SCOPE();   // str

        return JavascriptNumber::ToVarNoCheck(result, scriptContext);
    }